

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# console.c
# Opt level: O2

wchar_t console_askappend(LogPolicy *lp,Filename *filename,_func_void_void_ptr_int *callback,
                         void *ctx)

{
  size_t len;
  wchar_t wVar1;
  void *buf;
  termios cf;
  char line [32];
  termios newmode;
  termios oldmode;
  
  premsg(&cf);
  if (console_batch_mode == true) {
    wVar1 = L'\0';
    fprintf(_stderr,"The session log file \"%.*s\" already exists.\nLogging will not be enabled.\n",
            0x1000,filename->path);
    fflush(_stderr);
  }
  else {
    fprintf(_stderr,
            "The session log file \"%.*s\" already exists.\nYou can overwrite it with a new session log,\nappend your session log to the end of it,\nor disable session logging for this session.\nEnter \"y\" to wipe the file, \"n\" to append to it,\nor just press Return to disable logging.\nWipe the log file? (y/n, Return cancels logging) "
            ,0x1000,filename->path);
    fflush(_stderr);
    tcgetattr(0,(termios *)&oldmode);
    newmode.c_iflag = oldmode.c_iflag;
    newmode.c_oflag = oldmode.c_oflag;
    newmode.c_line = oldmode.c_line;
    newmode.c_cc[0] = oldmode.c_cc[0];
    newmode.c_cc[1] = oldmode.c_cc[1];
    newmode.c_cc[2] = oldmode.c_cc[2];
    newmode.c_cc[3] = oldmode.c_cc[3];
    newmode.c_cc[4] = oldmode.c_cc[4];
    newmode.c_cc[5] = oldmode.c_cc[5];
    newmode.c_cc[6] = oldmode.c_cc[6];
    newmode.c_cc[7] = oldmode.c_cc[7];
    newmode.c_cc[8] = oldmode.c_cc[8];
    newmode.c_cc[9] = oldmode.c_cc[9];
    newmode.c_cc[10] = oldmode.c_cc[10];
    newmode.c_cc[0xb] = oldmode.c_cc[0xb];
    newmode.c_cc[0xc] = oldmode.c_cc[0xc];
    newmode.c_cc[0xd] = oldmode.c_cc[0xd];
    newmode.c_cc[0xe] = oldmode.c_cc[0xe];
    newmode.c_cc[0xf] = oldmode.c_cc[0xf];
    newmode.c_cc[0x10] = oldmode.c_cc[0x10];
    newmode.c_cc[0x11] = oldmode.c_cc[0x11];
    newmode.c_cc[0x12] = oldmode.c_cc[0x12];
    newmode.c_cc[0x13] = oldmode.c_cc[0x13];
    newmode.c_cc[0x14] = oldmode.c_cc[0x14];
    newmode.c_cc[0x15] = oldmode.c_cc[0x15];
    newmode.c_cc[0x16] = oldmode.c_cc[0x16];
    newmode.c_ispeed = oldmode.c_ispeed;
    newmode.c_ospeed = oldmode.c_ospeed;
    newmode._8_8_ = oldmode._8_8_ | 0xb00000000;
    buf = (void *)0x0;
    tcsetattr(0,0,(termios *)&newmode);
    line[0] = '\0';
    block_and_read((wchar_t)line,buf,len);
    tcsetattr(0,0,(termios *)&oldmode);
    postmsg(&cf);
    if ((line[0] & 0xdfU) == 0x59) {
      wVar1 = L'\x02';
    }
    else {
      wVar1 = (wchar_t)((line[0] & 0xdfU) == 0x4e);
    }
  }
  return wVar1;
}

Assistant:

int console_askappend(LogPolicy *lp, Filename *filename,
                      void (*callback)(void *ctx, int result), void *ctx)
{
    static const char msgtemplate[] =
        "The session log file \"%.*s\" already exists.\n"
        "You can overwrite it with a new session log,\n"
        "append your session log to the end of it,\n"
        "or disable session logging for this session.\n"
        "Enter \"y\" to wipe the file, \"n\" to append to it,\n"
        "or just press Return to disable logging.\n"
        "Wipe the log file? (y/n, Return cancels logging) ";

    static const char msgtemplate_batch[] =
        "The session log file \"%.*s\" already exists.\n"
        "Logging will not be enabled.\n";

    char line[32];
    struct termios cf;

    premsg(&cf);
    if (console_batch_mode) {
        fprintf(stderr, msgtemplate_batch, FILENAME_MAX, filename->path);
        fflush(stderr);
        return 0;
    }
    fprintf(stderr, msgtemplate, FILENAME_MAX, filename->path);
    fflush(stderr);

    {
        struct termios oldmode, newmode;
        tcgetattr(0, &oldmode);
        newmode = oldmode;
        newmode.c_lflag |= ECHO | ISIG | ICANON;
        tcsetattr(0, TCSANOW, &newmode);
        line[0] = '\0';
        if (block_and_read(0, line, sizeof(line) - 1) <= 0)
            /* handled below */;
        tcsetattr(0, TCSANOW, &oldmode);
    }

    postmsg(&cf);
    if (line[0] == 'y' || line[0] == 'Y')
        return 2;
    else if (line[0] == 'n' || line[0] == 'N')
        return 1;
    else
        return 0;
}